

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

SoapySDRRange *
SoapySDRDevice_getGainRange
          (SoapySDRRange *__return_storage_ptr__,SoapySDRDevice *device,int direction,size_t channel
          )

{
  undefined1 *puVar1;
  double local_38;
  double dStack_30;
  double local_28;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x1a8))(&local_38,device,direction,channel);
  __return_storage_ptr__->minimum = local_38;
  __return_storage_ptr__->maximum = dStack_30;
  __return_storage_ptr__->step = local_28;
  return __return_storage_ptr__;
}

Assistant:

SoapySDRRange SoapySDRDevice_getGainRange(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return toRange(device->getGainRange(direction, channel));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRRangeNAN);
}